

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMulti.c
# Opt level: O0

void Abc_NtkMultiSetBounds(Abc_Ntk_t *pNtk,int nThresh,int nFaninMax)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *vCone_00;
  Abc_Obj_t *pAVar3;
  int nConeSize;
  int nFanouts;
  int i;
  Abc_Obj_t *pNode;
  Vec_Ptr_t *vCone;
  int nFaninMax_local;
  int nThresh_local;
  Abc_Ntk_t *pNtk_local;
  
  vCone_00 = Vec_PtrAlloc(10);
  for (nConeSize = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), nConeSize < iVar1; nConeSize = nConeSize + 1
      ) {
    pAVar3 = Abc_NtkObj(pNtk,nConeSize);
    if ((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 >> 4 & 1) != 0)) {
      __assert_fail("pNode->fMarkA == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                    ,0x18c,"void Abc_NtkMultiSetBounds(Abc_Ntk_t *, int, int)");
    }
  }
  for (nConeSize = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), nConeSize < iVar1; nConeSize = nConeSize + 1
      ) {
    pAVar3 = Abc_NtkObj(pNtk,nConeSize);
    if ((pAVar3 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar3), iVar1 != 0)) {
      iVar1 = Abc_ObjFanoutNum(pAVar3);
      iVar2 = Abc_NodeMffcSize(pAVar3);
      if (nThresh < (iVar1 + -1) * iVar2) {
        *(uint *)&pAVar3->field_0x14 = *(uint *)&pAVar3->field_0x14 & 0xffffffef | 0x10;
      }
    }
  }
  for (nConeSize = 0; iVar1 = Abc_NtkCoNum(pNtk), nConeSize < iVar1; nConeSize = nConeSize + 1) {
    pAVar3 = Abc_NtkCo(pNtk,nConeSize);
    pAVar3 = Abc_ObjFanin0(pAVar3);
    *(uint *)&pAVar3->field_0x14 = *(uint *)&pAVar3->field_0x14 & 0xffffffef | 0x10;
  }
  nConeSize = 0;
  do {
    iVar1 = Vec_PtrSize(pNtk->vObjs);
    if (iVar1 <= nConeSize) {
      Vec_PtrFree(vCone_00);
      return;
    }
    pAVar3 = Abc_NtkObj(pNtk,nConeSize);
    if (((pAVar3 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar3), iVar1 != 0)) &&
       ((*(uint *)&pAVar3->field_0x14 >> 4 & 1) != 0)) {
      do {
        iVar1 = Abc_NtkMultiLimit(pAVar3,vCone_00,nFaninMax);
      } while (iVar1 != 0);
      if (nFaninMax < vCone_00->nSize) {
        __assert_fail("vCone->nSize <= nFaninMax",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                      ,0x1a9,"void Abc_NtkMultiSetBounds(Abc_Ntk_t *, int, int)");
      }
    }
    nConeSize = nConeSize + 1;
  } while( true );
}

Assistant:

void Abc_NtkMultiSetBounds( Abc_Ntk_t * pNtk, int nThresh, int nFaninMax )
{
    Vec_Ptr_t * vCone = Vec_PtrAlloc(10);
    Abc_Obj_t * pNode;
    int i, nFanouts, nConeSize;

    // make sure the mark is not set
    Abc_NtkForEachObj( pNtk, pNode, i )
        assert( pNode->fMarkA == 0 );

    // mark the nodes where expansion stops using pNode->fMarkA
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        // skip PI/PO nodes
//        if ( Abc_NodeIsConst(pNode) )
//            continue;
        // mark the nodes with multiple fanouts
        nFanouts = Abc_ObjFanoutNum(pNode);
        nConeSize = Abc_NodeMffcSize(pNode);
        if ( (nFanouts - 1) * nConeSize > nThresh )
            pNode->fMarkA = 1;
    }

    // mark the PO drivers
    Abc_NtkForEachCo( pNtk, pNode, i )
        Abc_ObjFanin0(pNode)->fMarkA = 1;

    // make sure the fanin limit is met
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        // skip PI/PO nodes
//        if ( Abc_NodeIsConst(pNode) )
//            continue;
        if ( pNode->fMarkA == 0 )
            continue;
        // continue cutting branches until it meets the fanin limit
        while ( Abc_NtkMultiLimit(pNode, vCone, nFaninMax) );
        assert( vCone->nSize <= nFaninMax );  
    }
    Vec_PtrFree(vCone);
/*
    // make sure the fanin limit is met
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        // skip PI/PO nodes
//        if ( Abc_NodeIsConst(pNode) )
//            continue;
        if ( pNode->fMarkA == 0 )
            continue;
        Abc_NtkMultiCone( pNode, vCone );
        assert( vCone->nSize <= nFaninMax );    
    }
*/
}